

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O1

bool S2::AlwaysUpdateMinDistance<true>(S2Point *x,S2Point *a,S2Point *b,S1ChordAngle *min_dist)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  S1ChordAngle local_48;
  S2LogMessage local_40;
  
  bVar1 = IsUnitLength(x);
  bVar2 = true;
  if (bVar1) {
    bVar1 = IsUnitLength(a);
    if (bVar1) {
      bVar2 = IsUnitLength(b);
      bVar2 = !bVar2;
    }
  }
  if (bVar2) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0xa7,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,
               "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) ",
               0x50);
    if (bVar2) {
      abort();
    }
  }
  dVar6 = x->c_[0] - a->c_[0];
  dVar5 = x->c_[1] - a->c_[1];
  dVar3 = x->c_[2] - a->c_[2];
  dVar7 = x->c_[0] - b->c_[0];
  dVar4 = x->c_[1] - b->c_[1];
  dVar5 = dVar3 * dVar3 + dVar5 * dVar5 + dVar6 * dVar6;
  dVar3 = x->c_[2] - b->c_[2];
  dVar3 = dVar3 * dVar3 + dVar4 * dVar4 + dVar7 * dVar7;
  bVar2 = AlwaysUpdateMinInteriorDistance<true>(x,a,b,dVar5,dVar3,min_dist);
  if (!bVar2) {
    if (dVar5 <= dVar3) {
      dVar3 = dVar5;
    }
    if (4.0 <= dVar3) {
      dVar3 = 4.0;
    }
    S1ChordAngle::S1ChordAngle(&local_48,dVar3);
    min_dist->length2_ = (double)local_48;
  }
  return true;
}

Assistant:

inline bool AlwaysUpdateMinDistance(const S2Point& x,
                                    const S2Point& a, const S2Point& b,
                                    S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));

  double xa2 = (x-a).Norm2(), xb2 = (x-b).Norm2();
  if (AlwaysUpdateMinInteriorDistance<always_update>(x, a, b, xa2, xb2,
                                                     min_dist)) {
    return true;  // Minimum distance is attained along the edge interior.
  }
  // Otherwise the minimum distance is to one of the endpoints.
  double dist2 = min(xa2, xb2);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}